

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O3

char * COST_SENSITIVE::bufcache_label(label *ld,char *c)

{
  undefined8 uVar1;
  char *pcVar2;
  uint uVar3;
  wclass *pwVar4;
  ulong uVar5;
  
  *(long *)c = (long)(ld->costs)._end - (long)(ld->costs)._begin >> 4;
  pcVar2 = c + 8;
  pwVar4 = (ld->costs)._begin;
  if ((ld->costs)._end != pwVar4) {
    uVar3 = 1;
    uVar5 = 0;
    do {
      uVar1 = *(undefined8 *)&pwVar4[uVar5].partial_prediction;
      *(undefined8 *)pcVar2 = *(undefined8 *)(pwVar4 + uVar5);
      *(undefined8 *)(pcVar2 + 8) = uVar1;
      pcVar2 = pcVar2 + 0x10;
      uVar5 = (ulong)uVar3;
      pwVar4 = (ld->costs)._begin;
      uVar3 = uVar3 + 1;
    } while (uVar5 < (ulong)((long)(ld->costs)._end - (long)pwVar4 >> 4));
  }
  return pcVar2;
}

Assistant:

char* bufcache_label(label* ld, char* c)
{
  *(size_t*)c = ld->costs.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->costs.size(); i++)
  {
    *(wclass*)c = ld->costs[i];
    c += sizeof(wclass);
  }
  return c;
}